

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  Scene *pSVar60;
  long lVar61;
  ulong uVar62;
  ulong *puVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [64];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar143 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar151 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1840 [16];
  undefined1 (*local_1830) [16];
  ulong local_1828;
  undefined1 local_1820 [32];
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  Scene *local_1640;
  undefined1 auStack_1638 [24];
  long local_1620;
  undefined1 auStack_1618 [24];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined4 local_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  undefined1 local_15a0 [16];
  undefined4 local_1590;
  undefined4 uStack_158c;
  undefined4 uStack_1588;
  undefined4 uStack_1584;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined1 local_1570 [16];
  undefined4 local_1560;
  undefined4 uStack_155c;
  undefined4 uStack_1558;
  undefined4 uStack_1554;
  undefined1 local_1550 [16];
  uint local_1540;
  uint uStack_153c;
  uint uStack_1538;
  uint uStack_1534;
  uint uStack_1530;
  uint uStack_152c;
  uint uStack_1528;
  uint uStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar63 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar106 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar109 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar113 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  fVar110 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar114 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar116 = fVar110 * 0.99999964;
  fVar117 = fVar114 * 0.99999964;
  fVar118 = fVar115 * 0.99999964;
  fVar110 = fVar110 * 1.0000004;
  fVar114 = fVar114 * 1.0000004;
  fVar115 = fVar115 * 1.0000004;
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1828 = uVar64 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar86 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  iVar2 = (tray->tfar).field_0.i[k];
  auVar91 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_1420._16_16_ = mm_lookupmask_ps._240_16_;
  local_1420._0_16_ = mm_lookupmask_ps._0_16_;
  local_1830 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar76._16_4_ = 0x3f800000;
  auVar76._20_4_ = 0x3f800000;
  auVar76._24_4_ = 0x3f800000;
  auVar76._28_4_ = 0x3f800000;
  bVar68 = true;
  auVar69._8_4_ = 0xbf800000;
  auVar69._0_8_ = 0xbf800000bf800000;
  auVar69._12_4_ = 0xbf800000;
  auVar69._16_4_ = 0xbf800000;
  auVar69._20_4_ = 0xbf800000;
  auVar69._24_4_ = 0xbf800000;
  auVar69._28_4_ = 0xbf800000;
  auVar69 = vblendvps_avx(auVar76,auVar69,local_1420);
  auVar102 = ZEXT3264(auVar69);
  fVar119 = fVar116;
  fVar121 = fVar116;
  fVar122 = fVar116;
  fVar123 = fVar116;
  fVar124 = fVar116;
  fVar125 = fVar116;
  fVar126 = fVar116;
  fVar129 = fVar117;
  fVar130 = fVar117;
  fVar131 = fVar117;
  fVar132 = fVar117;
  fVar133 = fVar117;
  fVar134 = fVar117;
  fVar135 = fVar117;
  fVar136 = fVar118;
  fVar137 = fVar118;
  fVar138 = fVar118;
  fVar139 = fVar118;
  fVar140 = fVar118;
  fVar141 = fVar118;
  fVar142 = fVar118;
  fVar144 = fVar110;
  fVar145 = fVar110;
  fVar146 = fVar110;
  fVar147 = fVar110;
  fVar148 = fVar110;
  fVar149 = fVar110;
  fVar150 = fVar110;
  fVar152 = fVar114;
  fVar153 = fVar114;
  fVar154 = fVar114;
  fVar155 = fVar114;
  fVar156 = fVar114;
  fVar157 = fVar114;
  fVar158 = fVar114;
  fVar160 = fVar115;
  fVar161 = fVar115;
  fVar162 = fVar115;
  fVar163 = fVar115;
  fVar164 = fVar115;
  fVar165 = fVar115;
  fVar166 = fVar115;
  do {
    uVar65 = puVar63[-1];
    puVar63 = puVar63 + -1;
    local_1660 = auVar86._0_32_;
    local_1680 = auVar91._0_32_;
    local_16c0 = auVar106._0_32_;
    local_16e0 = auVar109._0_32_;
    local_1700 = auVar113._0_32_;
    while ((uVar65 & 8) == 0) {
      auVar69 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar64),local_16c0);
      auVar81._4_4_ = fVar119 * auVar69._4_4_;
      auVar81._0_4_ = fVar116 * auVar69._0_4_;
      auVar81._8_4_ = fVar121 * auVar69._8_4_;
      auVar81._12_4_ = fVar122 * auVar69._12_4_;
      auVar81._16_4_ = fVar123 * auVar69._16_4_;
      auVar81._20_4_ = fVar124 * auVar69._20_4_;
      auVar81._24_4_ = fVar125 * auVar69._24_4_;
      auVar81._28_4_ = auVar69._28_4_;
      auVar69 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar66),local_16e0);
      auVar28._4_4_ = fVar129 * auVar69._4_4_;
      auVar28._0_4_ = fVar117 * auVar69._0_4_;
      auVar28._8_4_ = fVar130 * auVar69._8_4_;
      auVar28._12_4_ = fVar131 * auVar69._12_4_;
      auVar28._16_4_ = fVar132 * auVar69._16_4_;
      auVar28._20_4_ = fVar133 * auVar69._20_4_;
      auVar28._24_4_ = fVar134 * auVar69._24_4_;
      auVar28._28_4_ = auVar69._28_4_;
      auVar69 = vmaxps_avx(auVar81,auVar28);
      auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + uVar62),local_1700);
      auVar29._4_4_ = fVar136 * auVar76._4_4_;
      auVar29._0_4_ = fVar118 * auVar76._0_4_;
      auVar29._8_4_ = fVar137 * auVar76._8_4_;
      auVar29._12_4_ = fVar138 * auVar76._12_4_;
      auVar29._16_4_ = fVar139 * auVar76._16_4_;
      auVar29._20_4_ = fVar140 * auVar76._20_4_;
      auVar29._24_4_ = fVar141 * auVar76._24_4_;
      auVar29._28_4_ = auVar76._28_4_;
      auVar76 = vmaxps_avx(auVar29,local_1660);
      auVar69 = vmaxps_avx(auVar69,auVar76);
      auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + local_1828),local_16c0);
      auVar30._4_4_ = fVar144 * auVar76._4_4_;
      auVar30._0_4_ = fVar110 * auVar76._0_4_;
      auVar30._8_4_ = fVar145 * auVar76._8_4_;
      auVar30._12_4_ = fVar146 * auVar76._12_4_;
      auVar30._16_4_ = fVar147 * auVar76._16_4_;
      auVar30._20_4_ = fVar148 * auVar76._20_4_;
      auVar30._24_4_ = fVar149 * auVar76._24_4_;
      auVar30._28_4_ = auVar76._28_4_;
      auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar66 ^ 0x20)),local_16e0);
      auVar31._4_4_ = fVar152 * auVar76._4_4_;
      auVar31._0_4_ = fVar114 * auVar76._0_4_;
      auVar31._8_4_ = fVar153 * auVar76._8_4_;
      auVar31._12_4_ = fVar154 * auVar76._12_4_;
      auVar31._16_4_ = fVar155 * auVar76._16_4_;
      auVar31._20_4_ = fVar156 * auVar76._20_4_;
      auVar31._24_4_ = fVar157 * auVar76._24_4_;
      auVar31._28_4_ = auVar76._28_4_;
      auVar76 = vminps_avx(auVar30,auVar31);
      auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar65 + 0x40 + (uVar62 ^ 0x20)),local_1700);
      auVar32._4_4_ = fVar160 * auVar81._4_4_;
      auVar32._0_4_ = fVar115 * auVar81._0_4_;
      auVar32._8_4_ = fVar161 * auVar81._8_4_;
      auVar32._12_4_ = fVar162 * auVar81._12_4_;
      auVar32._16_4_ = fVar163 * auVar81._16_4_;
      auVar32._20_4_ = fVar164 * auVar81._20_4_;
      auVar32._24_4_ = fVar165 * auVar81._24_4_;
      auVar32._28_4_ = auVar81._28_4_;
      auVar81 = vminps_avx(auVar32,local_1680);
      auVar76 = vminps_avx(auVar76,auVar81);
      auVar69 = vcmpps_avx(auVar69,auVar76,2);
      uVar59 = vmovmskps_avx(auVar69);
      if (uVar59 == 0) goto LAB_005e4a62;
      uVar56 = uVar65 & 0xfffffffffffffff0;
      lVar61 = 0;
      for (uVar65 = (ulong)(byte)uVar59; (uVar65 & 1) == 0;
          uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        lVar61 = lVar61 + 1;
      }
      uVar65 = *(ulong *)(uVar56 + lVar61 * 8);
      uVar59 = (uVar59 & 0xff) - 1 & uVar59 & 0xff;
      uVar58 = (ulong)uVar59;
      if (uVar59 != 0) {
        *puVar63 = uVar65;
        lVar61 = 0;
        for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          lVar61 = lVar61 + 1;
        }
        uVar59 = uVar59 - 1 & uVar59;
        uVar58 = (ulong)uVar59;
        bVar67 = uVar59 == 0;
        while( true ) {
          puVar63 = puVar63 + 1;
          uVar65 = *(ulong *)(uVar56 + lVar61 * 8);
          if (bVar67) break;
          *puVar63 = uVar65;
          lVar61 = 0;
          for (uVar65 = uVar58; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
            lVar61 = lVar61 + 1;
          }
          uVar58 = uVar58 - 1 & uVar58;
          bVar67 = uVar58 == 0;
        }
      }
    }
    uVar56 = (ulong)((uint)uVar65 & 0xf);
    if (uVar56 != 8) {
      uVar65 = uVar65 & 0xfffffffffffffff0;
      local_1620 = 0;
      local_16a0 = auVar102._0_32_;
      local_17c0 = fVar115;
      fStack_17bc = fVar160;
      fStack_17b8 = fVar161;
      fStack_17b4 = fVar162;
      fStack_17b0 = fVar163;
      fStack_17ac = fVar164;
      fStack_17a8 = fVar165;
      fStack_17a4 = fVar166;
      local_17a0 = fVar114;
      fStack_179c = fVar152;
      fStack_1798 = fVar153;
      fStack_1794 = fVar154;
      fStack_1790 = fVar155;
      fStack_178c = fVar156;
      fStack_1788 = fVar157;
      fStack_1784 = fVar158;
      local_1780 = fVar110;
      fStack_177c = fVar144;
      fStack_1778 = fVar145;
      fStack_1774 = fVar146;
      fStack_1770 = fVar147;
      fStack_176c = fVar148;
      fStack_1768 = fVar149;
      fStack_1764 = fVar150;
      local_1760 = fVar118;
      fStack_175c = fVar136;
      fStack_1758 = fVar137;
      fStack_1754 = fVar138;
      fStack_1750 = fVar139;
      fStack_174c = fVar140;
      fStack_1748 = fVar141;
      fStack_1744 = fVar142;
      local_1740 = fVar117;
      fStack_173c = fVar129;
      fStack_1738 = fVar130;
      fStack_1734 = fVar131;
      fStack_1730 = fVar132;
      fStack_172c = fVar133;
      fStack_1728 = fVar134;
      fStack_1724 = fVar135;
      local_1720 = fVar116;
      fStack_171c = fVar119;
      fStack_1718 = fVar121;
      fStack_1714 = fVar122;
      fStack_1710 = fVar123;
      fStack_170c = fVar124;
      fStack_1708 = fVar125;
      fStack_1704 = fVar126;
      do {
        lVar57 = local_1620 * 0xe0;
        lVar61 = uVar65 + 0xd0 + lVar57;
        local_1400 = *(undefined8 *)(lVar61 + 0x10);
        uStack_13f8 = *(undefined8 *)(lVar61 + 0x18);
        lVar61 = uVar65 + 0xc0 + lVar57;
        local_13e0 = *(undefined8 *)(lVar61 + 0x10);
        uStack_13d8 = *(undefined8 *)(lVar61 + 0x18);
        uStack_13d0 = local_13e0;
        uStack_13c8 = uStack_13d8;
        uStack_13f0 = local_1400;
        uStack_13e8 = uStack_13f8;
        auVar82._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x60 + lVar57);
        auVar82._0_16_ = *(undefined1 (*) [16])(uVar65 + lVar57);
        auVar73._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x70 + lVar57);
        auVar73._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x10 + lVar57);
        auVar101._16_16_ = *(undefined1 (*) [16])(uVar65 + 0x80 + lVar57);
        auVar101._0_16_ = *(undefined1 (*) [16])(uVar65 + 0x20 + lVar57);
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0x30 + lVar57);
        auVar107._16_16_ = auVar4;
        auVar107._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0x40 + lVar57);
        auVar87._16_16_ = auVar4;
        auVar87._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0x50 + lVar57);
        auVar93._16_16_ = auVar4;
        auVar93._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0x90 + lVar57);
        auVar103._16_16_ = auVar4;
        auVar103._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0xa0 + lVar57);
        auVar159._16_16_ = auVar4;
        auVar159._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar65 + 0xb0 + lVar57);
        auVar70._16_16_ = auVar4;
        auVar70._0_16_ = auVar4;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar127._4_4_ = uVar1;
        auVar127._0_4_ = uVar1;
        auVar127._8_4_ = uVar1;
        auVar127._12_4_ = uVar1;
        auVar127._16_4_ = uVar1;
        auVar127._20_4_ = uVar1;
        auVar127._24_4_ = uVar1;
        auVar127._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar143._4_4_ = uVar1;
        auVar143._0_4_ = uVar1;
        auVar143._8_4_ = uVar1;
        auVar143._12_4_ = uVar1;
        auVar143._16_4_ = uVar1;
        auVar143._20_4_ = uVar1;
        auVar143._24_4_ = uVar1;
        auVar143._28_4_ = uVar1;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar151._4_4_ = uVar3;
        auVar151._0_4_ = uVar3;
        auVar151._8_4_ = uVar3;
        auVar151._12_4_ = uVar3;
        auVar151._16_4_ = uVar3;
        auVar151._20_4_ = uVar3;
        auVar151._24_4_ = uVar3;
        auVar151._28_4_ = uVar3;
        auVar28 = vsubps_avx(auVar82,auVar127);
        local_1820 = vsubps_avx(auVar73,auVar143);
        local_15e0 = vsubps_avx(auVar101,auVar151);
        auVar69 = vsubps_avx(auVar107,auVar127);
        auVar76 = vsubps_avx(auVar87,auVar143);
        auVar81 = vsubps_avx(auVar93,auVar151);
        auVar29 = vsubps_avx(auVar103,auVar127);
        auVar30 = vsubps_avx(auVar159,auVar143);
        auVar31 = vsubps_avx(auVar70,auVar151);
        auVar32 = vsubps_avx(auVar29,auVar28);
        local_1440 = vsubps_avx(auVar30,local_1820);
        auVar70 = vsubps_avx(auVar31,local_15e0);
        auVar71._0_4_ = auVar28._0_4_ + auVar29._0_4_;
        auVar71._4_4_ = auVar28._4_4_ + auVar29._4_4_;
        auVar71._8_4_ = auVar28._8_4_ + auVar29._8_4_;
        auVar71._12_4_ = auVar28._12_4_ + auVar29._12_4_;
        auVar71._16_4_ = auVar28._16_4_ + auVar29._16_4_;
        auVar71._20_4_ = auVar28._20_4_ + auVar29._20_4_;
        auVar71._24_4_ = auVar28._24_4_ + auVar29._24_4_;
        auVar71._28_4_ = auVar28._28_4_ + auVar29._28_4_;
        auVar104._0_4_ = auVar30._0_4_ + local_1820._0_4_;
        auVar104._4_4_ = auVar30._4_4_ + local_1820._4_4_;
        auVar104._8_4_ = auVar30._8_4_ + local_1820._8_4_;
        auVar104._12_4_ = auVar30._12_4_ + local_1820._12_4_;
        auVar104._16_4_ = auVar30._16_4_ + local_1820._16_4_;
        auVar104._20_4_ = auVar30._20_4_ + local_1820._20_4_;
        auVar104._24_4_ = auVar30._24_4_ + local_1820._24_4_;
        auVar104._28_4_ = auVar30._28_4_ + local_1820._28_4_;
        fVar7 = local_15e0._0_4_;
        auVar88._0_4_ = auVar31._0_4_ + fVar7;
        fVar8 = local_15e0._4_4_;
        auVar88._4_4_ = auVar31._4_4_ + fVar8;
        fVar9 = local_15e0._8_4_;
        auVar88._8_4_ = auVar31._8_4_ + fVar9;
        fVar10 = local_15e0._12_4_;
        auVar88._12_4_ = auVar31._12_4_ + fVar10;
        fVar11 = local_15e0._16_4_;
        auVar88._16_4_ = auVar31._16_4_ + fVar11;
        fVar12 = local_15e0._20_4_;
        auVar88._20_4_ = auVar31._20_4_ + fVar12;
        fVar13 = local_15e0._24_4_;
        auVar88._24_4_ = auVar31._24_4_ + fVar13;
        fVar114 = auVar31._28_4_;
        auVar88._28_4_ = fVar114 + local_15e0._28_4_;
        auVar33._4_4_ = auVar70._4_4_ * auVar104._4_4_;
        auVar33._0_4_ = auVar70._0_4_ * auVar104._0_4_;
        auVar33._8_4_ = auVar70._8_4_ * auVar104._8_4_;
        auVar33._12_4_ = auVar70._12_4_ * auVar104._12_4_;
        auVar33._16_4_ = auVar70._16_4_ * auVar104._16_4_;
        auVar33._20_4_ = auVar70._20_4_ * auVar104._20_4_;
        auVar33._24_4_ = auVar70._24_4_ * auVar104._24_4_;
        auVar33._28_4_ = uVar1;
        auVar72 = vfmsub231ps_fma(auVar33,local_1440,auVar88);
        auVar38._4_4_ = auVar32._4_4_ * auVar88._4_4_;
        auVar38._0_4_ = auVar32._0_4_ * auVar88._0_4_;
        auVar38._8_4_ = auVar32._8_4_ * auVar88._8_4_;
        auVar38._12_4_ = auVar32._12_4_ * auVar88._12_4_;
        auVar38._16_4_ = auVar32._16_4_ * auVar88._16_4_;
        auVar38._20_4_ = auVar32._20_4_ * auVar88._20_4_;
        auVar38._24_4_ = auVar32._24_4_ * auVar88._24_4_;
        auVar38._28_4_ = auVar88._28_4_;
        auVar4 = vfmsub231ps_fma(auVar38,auVar70,auVar71);
        auVar39._4_4_ = local_1440._4_4_ * auVar71._4_4_;
        auVar39._0_4_ = local_1440._0_4_ * auVar71._0_4_;
        auVar39._8_4_ = local_1440._8_4_ * auVar71._8_4_;
        auVar39._12_4_ = local_1440._12_4_ * auVar71._12_4_;
        auVar39._16_4_ = local_1440._16_4_ * auVar71._16_4_;
        auVar39._20_4_ = local_1440._20_4_ * auVar71._20_4_;
        auVar39._24_4_ = local_1440._24_4_ * auVar71._24_4_;
        auVar39._28_4_ = auVar71._28_4_;
        auVar75 = vfmsub231ps_fma(auVar39,auVar32,auVar104);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar128._4_4_ = uVar1;
        auVar128._0_4_ = uVar1;
        auVar128._8_4_ = uVar1;
        auVar128._12_4_ = uVar1;
        auVar128._16_4_ = uVar1;
        auVar128._20_4_ = uVar1;
        auVar128._24_4_ = uVar1;
        auVar128._28_4_ = uVar1;
        local_1480 = *(float *)(ray + k * 4 + 0x60);
        auVar40._4_4_ = local_1480 * auVar75._4_4_;
        auVar40._0_4_ = local_1480 * auVar75._0_4_;
        auVar40._8_4_ = local_1480 * auVar75._8_4_;
        auVar40._12_4_ = local_1480 * auVar75._12_4_;
        auVar40._16_4_ = local_1480 * 0.0;
        auVar40._20_4_ = local_1480 * 0.0;
        auVar40._24_4_ = local_1480 * 0.0;
        auVar40._28_4_ = fVar114;
        auVar4 = vfmadd231ps_fma(auVar40,auVar128,ZEXT1632(auVar4));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_1460._4_4_ = uVar1;
        local_1460._0_4_ = uVar1;
        local_1460._8_4_ = uVar1;
        local_1460._12_4_ = uVar1;
        local_1460._16_4_ = uVar1;
        local_1460._20_4_ = uVar1;
        local_1460._24_4_ = uVar1;
        local_1460._28_4_ = uVar1;
        auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),local_1460,ZEXT1632(auVar72));
        local_14a0 = vsubps_avx(local_1820,auVar76);
        local_14c0 = vsubps_avx(local_15e0,auVar81);
        auVar77._0_4_ = auVar76._0_4_ + local_1820._0_4_;
        auVar77._4_4_ = auVar76._4_4_ + local_1820._4_4_;
        auVar77._8_4_ = auVar76._8_4_ + local_1820._8_4_;
        auVar77._12_4_ = auVar76._12_4_ + local_1820._12_4_;
        auVar77._16_4_ = auVar76._16_4_ + local_1820._16_4_;
        auVar77._20_4_ = auVar76._20_4_ + local_1820._20_4_;
        auVar77._24_4_ = auVar76._24_4_ + local_1820._24_4_;
        auVar77._28_4_ = auVar76._28_4_ + local_1820._28_4_;
        auVar89._0_4_ = fVar7 + auVar81._0_4_;
        auVar89._4_4_ = fVar8 + auVar81._4_4_;
        auVar89._8_4_ = fVar9 + auVar81._8_4_;
        auVar89._12_4_ = fVar10 + auVar81._12_4_;
        auVar89._16_4_ = fVar11 + auVar81._16_4_;
        auVar89._20_4_ = fVar12 + auVar81._20_4_;
        auVar89._24_4_ = fVar13 + auVar81._24_4_;
        fVar110 = auVar81._28_4_;
        auVar89._28_4_ = local_15e0._28_4_ + fVar110;
        fVar92 = local_14c0._0_4_;
        fVar97 = local_14c0._4_4_;
        auVar41._4_4_ = auVar77._4_4_ * fVar97;
        auVar41._0_4_ = auVar77._0_4_ * fVar92;
        fVar100 = local_14c0._8_4_;
        auVar41._8_4_ = auVar77._8_4_ * fVar100;
        fVar16 = local_14c0._12_4_;
        auVar41._12_4_ = auVar77._12_4_ * fVar16;
        fVar19 = local_14c0._16_4_;
        auVar41._16_4_ = auVar77._16_4_ * fVar19;
        fVar22 = local_14c0._20_4_;
        auVar41._20_4_ = auVar77._20_4_ * fVar22;
        fVar25 = local_14c0._24_4_;
        auVar41._24_4_ = auVar77._24_4_ * fVar25;
        auVar41._28_4_ = auVar104._28_4_;
        auVar75 = vfmsub231ps_fma(auVar41,local_14a0,auVar89);
        local_14e0 = vsubps_avx(auVar28,auVar69);
        fVar95 = local_14e0._0_4_;
        fVar98 = local_14e0._4_4_;
        auVar42._4_4_ = auVar89._4_4_ * fVar98;
        auVar42._0_4_ = auVar89._0_4_ * fVar95;
        fVar14 = local_14e0._8_4_;
        auVar42._8_4_ = auVar89._8_4_ * fVar14;
        fVar17 = local_14e0._12_4_;
        auVar42._12_4_ = auVar89._12_4_ * fVar17;
        fVar20 = local_14e0._16_4_;
        auVar42._16_4_ = auVar89._16_4_ * fVar20;
        fVar23 = local_14e0._20_4_;
        auVar42._20_4_ = auVar89._20_4_ * fVar23;
        fVar26 = local_14e0._24_4_;
        auVar42._24_4_ = auVar89._24_4_ * fVar26;
        auVar42._28_4_ = auVar89._28_4_;
        auVar111._0_4_ = auVar28._0_4_ + auVar69._0_4_;
        auVar111._4_4_ = auVar28._4_4_ + auVar69._4_4_;
        auVar111._8_4_ = auVar28._8_4_ + auVar69._8_4_;
        auVar111._12_4_ = auVar28._12_4_ + auVar69._12_4_;
        auVar111._16_4_ = auVar28._16_4_ + auVar69._16_4_;
        auVar111._20_4_ = auVar28._20_4_ + auVar69._20_4_;
        auVar111._24_4_ = auVar28._24_4_ + auVar69._24_4_;
        auVar111._28_4_ = auVar28._28_4_ + auVar69._28_4_;
        auVar72 = vfmsub231ps_fma(auVar42,local_14c0,auVar111);
        fVar96 = local_14a0._0_4_;
        fVar99 = local_14a0._4_4_;
        auVar43._4_4_ = auVar111._4_4_ * fVar99;
        auVar43._0_4_ = auVar111._0_4_ * fVar96;
        fVar15 = local_14a0._8_4_;
        auVar43._8_4_ = auVar111._8_4_ * fVar15;
        fVar18 = local_14a0._12_4_;
        auVar43._12_4_ = auVar111._12_4_ * fVar18;
        fVar21 = local_14a0._16_4_;
        auVar43._16_4_ = auVar111._16_4_ * fVar21;
        fVar24 = local_14a0._20_4_;
        auVar43._20_4_ = auVar111._20_4_ * fVar24;
        fVar27 = local_14a0._24_4_;
        auVar43._24_4_ = auVar111._24_4_ * fVar27;
        auVar43._28_4_ = auVar111._28_4_;
        auVar36 = vfmsub231ps_fma(auVar43,local_14e0,auVar77);
        auVar112._0_4_ = auVar36._0_4_ * local_1480;
        auVar112._4_4_ = auVar36._4_4_ * local_1480;
        auVar112._8_4_ = auVar36._8_4_ * local_1480;
        auVar112._12_4_ = auVar36._12_4_ * local_1480;
        auVar112._16_4_ = local_1480 * 0.0;
        auVar112._20_4_ = local_1480 * 0.0;
        auVar112._24_4_ = local_1480 * 0.0;
        auVar112._28_4_ = 0;
        auVar72 = vfmadd231ps_fma(auVar112,auVar128,ZEXT1632(auVar72));
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_1460,ZEXT1632(auVar75));
        auVar33 = vsubps_avx(auVar69,auVar29);
        auVar83._0_4_ = auVar69._0_4_ + auVar29._0_4_;
        auVar83._4_4_ = auVar69._4_4_ + auVar29._4_4_;
        auVar83._8_4_ = auVar69._8_4_ + auVar29._8_4_;
        auVar83._12_4_ = auVar69._12_4_ + auVar29._12_4_;
        auVar83._16_4_ = auVar69._16_4_ + auVar29._16_4_;
        auVar83._20_4_ = auVar69._20_4_ + auVar29._20_4_;
        auVar83._24_4_ = auVar69._24_4_ + auVar29._24_4_;
        auVar83._28_4_ = auVar69._28_4_ + auVar29._28_4_;
        auVar29 = vsubps_avx(auVar76,auVar30);
        auVar94._0_4_ = auVar76._0_4_ + auVar30._0_4_;
        auVar94._4_4_ = auVar76._4_4_ + auVar30._4_4_;
        auVar94._8_4_ = auVar76._8_4_ + auVar30._8_4_;
        auVar94._12_4_ = auVar76._12_4_ + auVar30._12_4_;
        auVar94._16_4_ = auVar76._16_4_ + auVar30._16_4_;
        auVar94._20_4_ = auVar76._20_4_ + auVar30._20_4_;
        auVar94._24_4_ = auVar76._24_4_ + auVar30._24_4_;
        auVar94._28_4_ = auVar76._28_4_ + auVar30._28_4_;
        auVar30 = vsubps_avx(auVar81,auVar31);
        auVar78._0_4_ = auVar81._0_4_ + auVar31._0_4_;
        auVar78._4_4_ = auVar81._4_4_ + auVar31._4_4_;
        auVar78._8_4_ = auVar81._8_4_ + auVar31._8_4_;
        auVar78._12_4_ = auVar81._12_4_ + auVar31._12_4_;
        auVar78._16_4_ = auVar81._16_4_ + auVar31._16_4_;
        auVar78._20_4_ = auVar81._20_4_ + auVar31._20_4_;
        auVar78._24_4_ = auVar81._24_4_ + auVar31._24_4_;
        auVar78._28_4_ = fVar110 + fVar114;
        auVar44._4_4_ = auVar30._4_4_ * auVar94._4_4_;
        auVar44._0_4_ = auVar30._0_4_ * auVar94._0_4_;
        auVar44._8_4_ = auVar30._8_4_ * auVar94._8_4_;
        auVar44._12_4_ = auVar30._12_4_ * auVar94._12_4_;
        auVar44._16_4_ = auVar30._16_4_ * auVar94._16_4_;
        auVar44._20_4_ = auVar30._20_4_ * auVar94._20_4_;
        auVar44._24_4_ = auVar30._24_4_ * auVar94._24_4_;
        auVar44._28_4_ = fVar110;
        auVar36 = vfmsub231ps_fma(auVar44,auVar29,auVar78);
        auVar45._4_4_ = auVar78._4_4_ * auVar33._4_4_;
        auVar45._0_4_ = auVar78._0_4_ * auVar33._0_4_;
        auVar45._8_4_ = auVar78._8_4_ * auVar33._8_4_;
        auVar45._12_4_ = auVar78._12_4_ * auVar33._12_4_;
        auVar45._16_4_ = auVar78._16_4_ * auVar33._16_4_;
        auVar45._20_4_ = auVar78._20_4_ * auVar33._20_4_;
        auVar45._24_4_ = auVar78._24_4_ * auVar33._24_4_;
        auVar45._28_4_ = auVar78._28_4_;
        auVar75 = vfmsub231ps_fma(auVar45,auVar30,auVar83);
        auVar46._4_4_ = auVar29._4_4_ * auVar83._4_4_;
        auVar46._0_4_ = auVar29._0_4_ * auVar83._0_4_;
        auVar46._8_4_ = auVar29._8_4_ * auVar83._8_4_;
        auVar46._12_4_ = auVar29._12_4_ * auVar83._12_4_;
        auVar46._16_4_ = auVar29._16_4_ * auVar83._16_4_;
        auVar46._20_4_ = auVar29._20_4_ * auVar83._20_4_;
        auVar46._24_4_ = auVar29._24_4_ * auVar83._24_4_;
        auVar46._28_4_ = auVar83._28_4_;
        auVar37 = vfmsub231ps_fma(auVar46,auVar33,auVar94);
        auVar84._0_4_ = local_1480 * auVar37._0_4_;
        auVar84._4_4_ = local_1480 * auVar37._4_4_;
        auVar84._8_4_ = local_1480 * auVar37._8_4_;
        auVar84._12_4_ = local_1480 * auVar37._12_4_;
        auVar84._16_4_ = local_1480 * 0.0;
        auVar84._20_4_ = local_1480 * 0.0;
        auVar84._24_4_ = local_1480 * 0.0;
        auVar84._28_4_ = 0;
        auVar75 = vfmadd231ps_fma(auVar84,auVar128,ZEXT1632(auVar75));
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),local_1460,ZEXT1632(auVar36));
        local_13a0 = ZEXT1632(auVar72);
        local_13c0 = auVar4._0_4_;
        fStack_13bc = auVar4._4_4_;
        fStack_13b8 = auVar4._8_4_;
        fStack_13b4 = auVar4._12_4_;
        local_1380 = ZEXT1632(CONCAT412(auVar75._12_4_ + auVar72._12_4_ + fStack_13b4,
                                        CONCAT48(auVar75._8_4_ + auVar72._8_4_ + fStack_13b8,
                                                 CONCAT44(auVar75._4_4_ +
                                                          auVar72._4_4_ + fStack_13bc,
                                                          auVar75._0_4_ + auVar72._0_4_ + local_13c0
                                                         ))));
        auVar79._8_4_ = 0x7fffffff;
        auVar79._0_8_ = 0x7fffffff7fffffff;
        auVar79._12_4_ = 0x7fffffff;
        auVar79._16_4_ = 0x7fffffff;
        auVar79._20_4_ = 0x7fffffff;
        auVar79._24_4_ = 0x7fffffff;
        auVar79._28_4_ = 0x7fffffff;
        auVar69 = vminps_avx(ZEXT1632(auVar4),local_13a0);
        auVar69 = vminps_avx(auVar69,ZEXT1632(auVar75));
        local_1520 = vandps_avx(local_1380,auVar79);
        fVar110 = local_1520._0_4_ * 1.1920929e-07;
        fVar114 = local_1520._4_4_ * 1.1920929e-07;
        auVar47._4_4_ = fVar114;
        auVar47._0_4_ = fVar110;
        fVar115 = local_1520._8_4_ * 1.1920929e-07;
        auVar47._8_4_ = fVar115;
        fVar116 = local_1520._12_4_ * 1.1920929e-07;
        auVar47._12_4_ = fVar116;
        fVar117 = local_1520._16_4_ * 1.1920929e-07;
        auVar47._16_4_ = fVar117;
        fVar118 = local_1520._20_4_ * 1.1920929e-07;
        auVar47._20_4_ = fVar118;
        fVar119 = local_1520._24_4_ * 1.1920929e-07;
        auVar47._24_4_ = fVar119;
        auVar47._28_4_ = 0x34000000;
        auVar105._0_8_ = CONCAT44(fVar114,fVar110) ^ 0x8000000080000000;
        auVar105._8_4_ = -fVar115;
        auVar105._12_4_ = -fVar116;
        auVar105._16_4_ = -fVar117;
        auVar105._20_4_ = -fVar118;
        auVar105._24_4_ = -fVar119;
        auVar105._28_4_ = 0xb4000000;
        auVar69 = vcmpps_avx(auVar69,auVar105,5);
        local_1500 = ZEXT1632(auVar4);
        auVar81 = vmaxps_avx(local_1500,local_13a0);
        auVar76 = vmaxps_avx(auVar81,ZEXT1632(auVar75));
        auVar76 = vcmpps_avx(auVar76,auVar47,2);
        auVar76 = vorps_avx(auVar69,auVar76);
        fVar119 = fStack_171c;
        fVar121 = fStack_1718;
        fVar122 = fStack_1714;
        fVar123 = fStack_1710;
        fVar124 = fStack_170c;
        fVar125 = fStack_1708;
        fVar126 = fStack_1704;
        fVar116 = local_1720;
        fVar129 = fStack_173c;
        fVar130 = fStack_1738;
        fVar131 = fStack_1734;
        fVar132 = fStack_1730;
        fVar133 = fStack_172c;
        fVar134 = fStack_1728;
        fVar135 = fStack_1724;
        fVar117 = local_1740;
        fVar136 = fStack_175c;
        fVar137 = fStack_1758;
        fVar138 = fStack_1754;
        fVar139 = fStack_1750;
        fVar140 = fStack_174c;
        fVar141 = fStack_1748;
        fVar142 = fStack_1744;
        fVar118 = local_1760;
        fVar144 = fStack_177c;
        fVar145 = fStack_1778;
        fVar146 = fStack_1774;
        fVar147 = fStack_1770;
        fVar148 = fStack_176c;
        fVar149 = fStack_1768;
        fVar150 = fStack_1764;
        fVar110 = local_1780;
        fVar152 = fStack_179c;
        fVar153 = fStack_1798;
        fVar154 = fStack_1794;
        fVar155 = fStack_1790;
        fVar156 = fStack_178c;
        fVar157 = fStack_1788;
        fVar158 = fStack_1784;
        fVar114 = local_17a0;
        fVar160 = fStack_17bc;
        fVar161 = fStack_17b8;
        fVar162 = fStack_17b4;
        fVar163 = fStack_17b0;
        fVar164 = fStack_17ac;
        fVar165 = fStack_17a8;
        fVar166 = fStack_17a4;
        fVar115 = local_17c0;
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0x7f,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar76 >> 0xbf,0) == '\0') &&
            (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar76[0x1f]) {
LAB_005e49de:
          auVar106 = ZEXT3264(local_16c0);
          auVar109 = ZEXT3264(local_16e0);
          auVar113 = ZEXT3264(local_1700);
          auVar86 = ZEXT3264(local_1660);
          auVar91 = ZEXT3264(local_1680);
          auVar102 = ZEXT3264(local_16a0);
        }
        else {
          auVar48._4_4_ = fVar99 * auVar70._4_4_;
          auVar48._0_4_ = fVar96 * auVar70._0_4_;
          auVar48._8_4_ = fVar15 * auVar70._8_4_;
          auVar48._12_4_ = fVar18 * auVar70._12_4_;
          auVar48._16_4_ = fVar21 * auVar70._16_4_;
          auVar48._20_4_ = fVar24 * auVar70._20_4_;
          auVar48._24_4_ = fVar27 * auVar70._24_4_;
          auVar48._28_4_ = auVar69._28_4_;
          auVar49._4_4_ = fVar98 * local_1440._4_4_;
          auVar49._0_4_ = fVar95 * local_1440._0_4_;
          auVar49._8_4_ = fVar14 * local_1440._8_4_;
          auVar49._12_4_ = fVar17 * local_1440._12_4_;
          auVar49._16_4_ = fVar20 * local_1440._16_4_;
          auVar49._20_4_ = fVar23 * local_1440._20_4_;
          auVar49._24_4_ = fVar26 * local_1440._24_4_;
          auVar49._28_4_ = 0x34000000;
          auVar4 = vfmsub213ps_fma(local_1440,local_14c0,auVar48);
          auVar50._4_4_ = auVar29._4_4_ * fVar97;
          auVar50._0_4_ = auVar29._0_4_ * fVar92;
          auVar50._8_4_ = auVar29._8_4_ * fVar100;
          auVar50._12_4_ = auVar29._12_4_ * fVar16;
          auVar50._16_4_ = auVar29._16_4_ * fVar19;
          auVar50._20_4_ = auVar29._20_4_ * fVar22;
          auVar50._24_4_ = auVar29._24_4_ * fVar25;
          auVar50._28_4_ = auVar81._28_4_;
          auVar51._4_4_ = fVar98 * auVar30._4_4_;
          auVar51._0_4_ = fVar95 * auVar30._0_4_;
          auVar51._8_4_ = fVar14 * auVar30._8_4_;
          auVar51._12_4_ = fVar17 * auVar30._12_4_;
          auVar51._16_4_ = fVar20 * auVar30._16_4_;
          auVar51._20_4_ = fVar23 * auVar30._20_4_;
          auVar51._24_4_ = fVar26 * auVar30._24_4_;
          auVar51._28_4_ = local_1520._28_4_;
          auVar75 = vfmsub213ps_fma(auVar30,local_14a0,auVar50);
          auVar69 = vandps_avx(auVar48,auVar79);
          auVar81 = vandps_avx(auVar50,auVar79);
          auVar69 = vcmpps_avx(auVar69,auVar81,1);
          local_1360 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar4),auVar69);
          auVar52._4_4_ = fVar99 * auVar33._4_4_;
          auVar52._0_4_ = fVar96 * auVar33._0_4_;
          auVar52._8_4_ = fVar15 * auVar33._8_4_;
          auVar52._12_4_ = fVar18 * auVar33._12_4_;
          auVar52._16_4_ = fVar21 * auVar33._16_4_;
          auVar52._20_4_ = fVar24 * auVar33._20_4_;
          auVar52._24_4_ = fVar27 * auVar33._24_4_;
          auVar52._28_4_ = auVar69._28_4_;
          auVar4 = vfmsub213ps_fma(auVar33,local_14c0,auVar51);
          auVar53._4_4_ = auVar32._4_4_ * fVar97;
          auVar53._0_4_ = auVar32._0_4_ * fVar92;
          auVar53._8_4_ = auVar32._8_4_ * fVar100;
          auVar53._12_4_ = auVar32._12_4_ * fVar16;
          auVar53._16_4_ = auVar32._16_4_ * fVar19;
          auVar53._20_4_ = auVar32._20_4_ * fVar22;
          auVar53._24_4_ = auVar32._24_4_ * fVar25;
          auVar53._28_4_ = auVar81._28_4_;
          auVar75 = vfmsub213ps_fma(auVar70,local_14e0,auVar53);
          auVar69 = vandps_avx(auVar53,auVar79);
          auVar81 = vandps_avx(auVar51,auVar79);
          auVar69 = vcmpps_avx(auVar69,auVar81,1);
          local_1340 = vblendvps_avx(ZEXT1632(auVar4),ZEXT1632(auVar75),auVar69);
          auVar4 = vfmsub213ps_fma(auVar32,local_14a0,auVar49);
          auVar75 = vfmsub213ps_fma(auVar29,local_14e0,auVar52);
          auVar69 = vandps_avx(auVar49,auVar79);
          auVar81 = vandps_avx(auVar52,auVar79);
          auVar69 = vcmpps_avx(auVar69,auVar81,1);
          local_1320 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar4),auVar69);
          auVar4 = vpackssdw_avx(auVar76._0_16_,auVar76._16_16_);
          fVar92 = local_1320._0_4_;
          auVar80._0_4_ = fVar92 * local_1480;
          fVar95 = local_1320._4_4_;
          auVar80._4_4_ = fVar95 * local_1480;
          fVar96 = local_1320._8_4_;
          auVar80._8_4_ = fVar96 * local_1480;
          fVar97 = local_1320._12_4_;
          auVar80._12_4_ = fVar97 * local_1480;
          fVar98 = local_1320._16_4_;
          auVar80._16_4_ = fVar98 * local_1480;
          fVar99 = local_1320._20_4_;
          auVar80._20_4_ = fVar99 * local_1480;
          fVar100 = local_1320._24_4_;
          auVar80._24_4_ = fVar100 * local_1480;
          auVar80._28_4_ = 0;
          auVar75 = vfmadd213ps_fma(auVar128,local_1340,auVar80);
          auVar75 = vfmadd213ps_fma(local_1460,local_1360,ZEXT1632(auVar75));
          auVar81 = ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                       CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                CONCAT44(auVar75._4_4_ + auVar75._4_4_,
                                                         auVar75._0_4_ + auVar75._0_4_))));
          auVar54._4_4_ = fVar95 * fVar8;
          auVar54._0_4_ = fVar92 * fVar7;
          auVar54._8_4_ = fVar96 * fVar9;
          auVar54._12_4_ = fVar97 * fVar10;
          auVar54._16_4_ = fVar98 * fVar11;
          auVar54._20_4_ = fVar99 * fVar12;
          auVar54._24_4_ = fVar100 * fVar13;
          auVar54._28_4_ = auVar76._28_4_;
          auVar75 = vfmadd213ps_fma(local_1820,local_1340,auVar54);
          auVar36 = vfmadd213ps_fma(auVar28,local_1360,ZEXT1632(auVar75));
          auVar69 = vrcpps_avx(auVar81);
          auVar120._8_4_ = 0x3f800000;
          auVar120._0_8_ = 0x3f8000003f800000;
          auVar120._12_4_ = 0x3f800000;
          auVar120._16_4_ = 0x3f800000;
          auVar120._20_4_ = 0x3f800000;
          auVar120._24_4_ = 0x3f800000;
          auVar120._28_4_ = 0x3f800000;
          auVar75 = vfnmadd213ps_fma(auVar69,auVar81,auVar120);
          auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar69,auVar69);
          local_12a0 = ZEXT1632(CONCAT412(auVar75._12_4_ * (auVar36._12_4_ + auVar36._12_4_),
                                          CONCAT48(auVar75._8_4_ * (auVar36._8_4_ + auVar36._8_4_),
                                                   CONCAT44(auVar75._4_4_ *
                                                            (auVar36._4_4_ + auVar36._4_4_),
                                                            auVar75._0_4_ *
                                                            (auVar36._0_4_ + auVar36._0_4_)))));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_1600._4_4_ = uVar1;
          local_1600._0_4_ = uVar1;
          local_1600._8_4_ = uVar1;
          local_1600._12_4_ = uVar1;
          local_1600._16_4_ = uVar1;
          local_1600._20_4_ = uVar1;
          local_1600._24_4_ = uVar1;
          local_1600._28_4_ = uVar1;
          auVar69 = vcmpps_avx(auVar108,local_12a0,2);
          auVar76 = vcmpps_avx(local_12a0,local_1600,2);
          auVar69 = vandps_avx(auVar69,auVar76);
          auVar75 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
          auVar4 = vpand_avx(auVar75,auVar4);
          auVar69 = vpmovsxwd_avx2(auVar4);
          if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar69 >> 0x7f,0) == '\0') &&
                (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar69 >> 0xbf,0) == '\0') &&
              (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar69[0x1f]) goto LAB_005e49de;
          auVar69 = vcmpps_avx(auVar81,_DAT_01faff00,4);
          auVar75 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
          auVar4 = vpand_avx(auVar4,auVar75);
          local_1300 = vpmovsxwd_avx2(auVar4);
          if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0x7f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_1300 >> 0xbf,0) == '\0') &&
              (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_1300[0x1f]) goto LAB_005e49de;
          auStack_1618 = auVar70._8_24_;
          uStack_13b0 = 0;
          uStack_13ac = 0;
          uStack_13a8 = 0;
          uStack_13a4 = 0;
          local_1220 = local_1420;
          auVar69 = vrcpps_avx(local_1380);
          auVar90._8_4_ = 0x3f800000;
          auVar90._0_8_ = 0x3f8000003f800000;
          auVar90._12_4_ = 0x3f800000;
          auVar90._16_4_ = 0x3f800000;
          auVar90._20_4_ = 0x3f800000;
          auVar90._24_4_ = 0x3f800000;
          auVar90._28_4_ = 0x3f800000;
          auVar75 = vfnmadd213ps_fma(local_1380,auVar69,auVar90);
          auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar69,auVar69);
          auVar85._8_4_ = 0x219392ef;
          auVar85._0_8_ = 0x219392ef219392ef;
          auVar85._12_4_ = 0x219392ef;
          auVar85._16_4_ = 0x219392ef;
          auVar85._20_4_ = 0x219392ef;
          auVar85._24_4_ = 0x219392ef;
          auVar85._28_4_ = 0x219392ef;
          auVar69 = vcmpps_avx(local_1520,auVar85,5);
          auVar69 = vandps_avx(auVar69,ZEXT1632(auVar75));
          auVar55._4_4_ = fStack_13bc * auVar69._4_4_;
          auVar55._0_4_ = local_13c0 * auVar69._0_4_;
          auVar55._8_4_ = fStack_13b8 * auVar69._8_4_;
          auVar55._12_4_ = fStack_13b4 * auVar69._12_4_;
          auVar55._16_4_ = auVar69._16_4_ * 0.0;
          auVar55._20_4_ = auVar69._20_4_ * 0.0;
          auVar55._24_4_ = auVar69._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar76 = vminps_avx(auVar55,auVar90);
          auVar74._0_4_ = auVar72._0_4_ * auVar69._0_4_;
          auVar74._4_4_ = auVar72._4_4_ * auVar69._4_4_;
          auVar74._8_4_ = auVar72._8_4_ * auVar69._8_4_;
          auVar74._12_4_ = auVar72._12_4_ * auVar69._12_4_;
          auVar74._16_4_ = auVar69._16_4_ * 0.0;
          auVar74._20_4_ = auVar69._20_4_ * 0.0;
          auVar74._24_4_ = auVar69._24_4_ * 0.0;
          auVar74._28_4_ = 0;
          auVar69 = vminps_avx(auVar74,auVar90);
          auVar81 = vsubps_avx(auVar90,auVar76);
          auVar29 = vsubps_avx(auVar90,auVar69);
          local_12c0 = vblendvps_avx(auVar69,auVar81,local_1420);
          local_12e0 = vblendvps_avx(auVar76,auVar29,local_1420);
          auVar102 = ZEXT3264(local_16a0);
          fVar7 = local_16a0._0_4_;
          fVar8 = local_16a0._4_4_;
          fVar9 = local_16a0._8_4_;
          fVar10 = local_16a0._12_4_;
          fVar11 = local_16a0._16_4_;
          fVar12 = local_16a0._20_4_;
          fVar13 = local_16a0._24_4_;
          local_1260._4_4_ = fVar8 * local_1340._4_4_;
          local_1260._0_4_ = fVar7 * local_1340._0_4_;
          local_1260._8_4_ = fVar9 * local_1340._8_4_;
          local_1260._12_4_ = fVar10 * local_1340._12_4_;
          local_1260._16_4_ = fVar11 * local_1340._16_4_;
          local_1260._20_4_ = fVar12 * local_1340._20_4_;
          local_1260._24_4_ = fVar13 * local_1340._24_4_;
          local_1260._28_4_ = local_12c0._28_4_;
          local_1280[0] = local_1360._0_4_ * fVar7;
          local_1280[1] = local_1360._4_4_ * fVar8;
          local_1280[2] = local_1360._8_4_ * fVar9;
          local_1280[3] = local_1360._12_4_ * fVar10;
          fStack_1270 = local_1360._16_4_ * fVar11;
          fStack_126c = local_1360._20_4_ * fVar12;
          fStack_1268 = local_1360._24_4_ * fVar13;
          uStack_1264 = local_12e0._28_4_;
          local_1240[0] = fVar7 * fVar92;
          local_1240[1] = fVar8 * fVar95;
          local_1240[2] = fVar9 * fVar96;
          local_1240[3] = fVar10 * fVar97;
          fStack_1230 = fVar11 * fVar98;
          fStack_122c = fVar12 * fVar99;
          fStack_1228 = fVar13 * fVar100;
          uStack_1224 = auVar81._28_4_;
          auVar4 = vpacksswb_avx(auVar4,auVar4);
          uVar58 = (ulong)(byte)(SUB161(auVar4 >> 7,0) & 1 | (SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar4 >> 0x37,0) & 1) << 6 | SUB161(auVar4 >> 0x3f,0) << 7
                                );
          auVar106 = ZEXT3264(local_16c0);
          auVar109 = ZEXT3264(local_16e0);
          auVar113 = ZEXT3264(local_1700);
          auVar86 = ZEXT3264(local_1660);
          auVar91 = ZEXT3264(local_1680);
          auStack_1638 = auVar28._8_24_;
          local_1640 = context->scene;
          pSVar60 = context->scene;
          fStack_147c = local_1480;
          fStack_1478 = local_1480;
          fStack_1474 = local_1480;
          fStack_1470 = local_1480;
          fStack_146c = local_1480;
          fStack_1468 = local_1480;
          fStack_1464 = local_1480;
          do {
            uVar34 = 0;
            for (uVar35 = uVar58; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              uVar34 = uVar34 + 1;
            }
            uVar59 = *(uint *)((long)&local_13e0 + uVar34 * 4);
            pGVar5 = (pSVar60->geometries).items[uVar59].ptr;
            if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar58 = uVar58 ^ 1L << (uVar34 & 0x3f);
            }
            else {
              local_1820._0_8_ = uVar34;
              local_15e0._0_8_ = uVar58;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005e4a78:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar68;
              }
              uVar58 = (ulong)(uint)((int)uVar34 * 4);
              local_1580 = *(undefined4 *)(local_12e0 + uVar58);
              uVar1 = *(undefined4 *)(local_12c0 + uVar58);
              local_1570._4_4_ = uVar1;
              local_1570._0_4_ = uVar1;
              local_1570._8_4_ = uVar1;
              local_1570._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar58);
              local_17f0.context = context->user;
              local_1550._4_4_ = uVar59;
              local_1550._0_4_ = uVar59;
              local_1550._8_4_ = uVar59;
              local_1550._12_4_ = uVar59;
              local_1560 = *(undefined4 *)((long)&local_1400 + uVar58);
              local_15b0 = *(undefined4 *)((long)local_1280 + uVar58);
              uVar1 = *(undefined4 *)(local_1260 + uVar58);
              local_15a0._4_4_ = uVar1;
              local_15a0._0_4_ = uVar1;
              local_15a0._8_4_ = uVar1;
              local_15a0._12_4_ = uVar1;
              local_1590 = *(undefined4 *)((long)local_1240 + uVar58);
              vpcmpeqd_avx2(ZEXT1632(local_1550),ZEXT1632(local_1550));
              uStack_153c = (local_17f0.context)->instID[0];
              local_1540 = uStack_153c;
              uStack_1538 = uStack_153c;
              uStack_1534 = uStack_153c;
              uStack_1530 = (local_17f0.context)->instPrimID[0];
              uStack_152c = uStack_1530;
              uStack_1528 = uStack_1530;
              uStack_1524 = uStack_1530;
              local_1840 = *local_1830;
              local_17f0.valid = (int *)local_1840;
              local_17f0.geometryUserPtr = pGVar5->userPtr;
              local_17f0.hit = (RTCHitN *)&local_15b0;
              local_17f0.N = 4;
              local_17f0.ray = (RTCRayN *)ray;
              uStack_15ac = local_15b0;
              uStack_15a8 = local_15b0;
              uStack_15a4 = local_15b0;
              uStack_158c = local_1590;
              uStack_1588 = local_1590;
              uStack_1584 = local_1590;
              uStack_157c = local_1580;
              uStack_1578 = local_1580;
              uStack_1574 = local_1580;
              uStack_155c = local_1560;
              uStack_1558 = local_1560;
              uStack_1554 = local_1560;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&local_17f0);
                auVar113 = ZEXT3264(local_1700);
                auVar109 = ZEXT3264(local_16e0);
                auVar106 = ZEXT3264(local_16c0);
                fVar116 = local_1720;
                fVar119 = fStack_171c;
                fVar121 = fStack_1718;
                fVar122 = fStack_1714;
                fVar123 = fStack_1710;
                fVar124 = fStack_170c;
                fVar125 = fStack_1708;
                fVar126 = fStack_1704;
                fVar117 = local_1740;
                fVar129 = fStack_173c;
                fVar130 = fStack_1738;
                fVar131 = fStack_1734;
                fVar132 = fStack_1730;
                fVar133 = fStack_172c;
                fVar134 = fStack_1728;
                fVar135 = fStack_1724;
                fVar118 = local_1760;
                fVar136 = fStack_175c;
                fVar137 = fStack_1758;
                fVar138 = fStack_1754;
                fVar139 = fStack_1750;
                fVar140 = fStack_174c;
                fVar141 = fStack_1748;
                fVar142 = fStack_1744;
                fVar110 = local_1780;
                fVar144 = fStack_177c;
                fVar145 = fStack_1778;
                fVar146 = fStack_1774;
                fVar147 = fStack_1770;
                fVar148 = fStack_176c;
                fVar149 = fStack_1768;
                fVar150 = fStack_1764;
                fVar114 = local_17a0;
                fVar152 = fStack_179c;
                fVar153 = fStack_1798;
                fVar154 = fStack_1794;
                fVar155 = fStack_1790;
                fVar156 = fStack_178c;
                fVar157 = fStack_1788;
                fVar158 = fStack_1784;
                fVar115 = local_17c0;
                fVar160 = fStack_17bc;
                fVar161 = fStack_17b8;
                fVar162 = fStack_17b4;
                fVar163 = fStack_17b0;
                fVar164 = fStack_17ac;
                fVar165 = fStack_17a8;
                fVar166 = fStack_17a4;
              }
              if (local_1840 == (undefined1  [16])0x0) {
                auVar4 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar4 = auVar4 ^ _DAT_01f7ae20;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var6)(&local_17f0);
                  auVar113 = ZEXT3264(local_1700);
                  auVar109 = ZEXT3264(local_16e0);
                  auVar106 = ZEXT3264(local_16c0);
                  fVar116 = local_1720;
                  fVar119 = fStack_171c;
                  fVar121 = fStack_1718;
                  fVar122 = fStack_1714;
                  fVar123 = fStack_1710;
                  fVar124 = fStack_170c;
                  fVar125 = fStack_1708;
                  fVar126 = fStack_1704;
                  fVar117 = local_1740;
                  fVar129 = fStack_173c;
                  fVar130 = fStack_1738;
                  fVar131 = fStack_1734;
                  fVar132 = fStack_1730;
                  fVar133 = fStack_172c;
                  fVar134 = fStack_1728;
                  fVar135 = fStack_1724;
                  fVar118 = local_1760;
                  fVar136 = fStack_175c;
                  fVar137 = fStack_1758;
                  fVar138 = fStack_1754;
                  fVar139 = fStack_1750;
                  fVar140 = fStack_174c;
                  fVar141 = fStack_1748;
                  fVar142 = fStack_1744;
                  fVar110 = local_1780;
                  fVar144 = fStack_177c;
                  fVar145 = fStack_1778;
                  fVar146 = fStack_1774;
                  fVar147 = fStack_1770;
                  fVar148 = fStack_176c;
                  fVar149 = fStack_1768;
                  fVar150 = fStack_1764;
                  fVar114 = local_17a0;
                  fVar152 = fStack_179c;
                  fVar153 = fStack_1798;
                  fVar154 = fStack_1794;
                  fVar155 = fStack_1790;
                  fVar156 = fStack_178c;
                  fVar157 = fStack_1788;
                  fVar158 = fStack_1784;
                  fVar115 = local_17c0;
                  fVar160 = fStack_17bc;
                  fVar161 = fStack_17b8;
                  fVar162 = fStack_17b4;
                  fVar163 = fStack_17b0;
                  fVar164 = fStack_17ac;
                  fVar165 = fStack_17a8;
                  fVar166 = fStack_17a4;
                }
                auVar72 = vpcmpeqd_avx(local_1840,_DAT_01f7aa10);
                auVar4 = auVar72 ^ _DAT_01f7ae20;
                auVar75._8_4_ = 0xff800000;
                auVar75._0_8_ = 0xff800000ff800000;
                auVar75._12_4_ = 0xff800000;
                auVar72 = vblendvps_avx(auVar75,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                        auVar72);
                *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar72;
              }
              auVar86 = ZEXT3264(local_1660);
              auVar91 = ZEXT3264(local_1680);
              auVar102 = ZEXT3264(local_16a0);
              auVar72._8_8_ = 0x100000001;
              auVar72._0_8_ = 0x100000001;
              if ((auVar72 & auVar4) != (undefined1  [16])0x0) goto LAB_005e4a78;
              *(int *)(ray + k * 4 + 0x80) = local_1600._0_4_;
              uVar58 = local_15e0._0_8_ ^ 1L << (local_1820._0_8_ & 0x3f);
            }
            pSVar60 = local_1640;
          } while (uVar58 != 0);
        }
        local_1620 = local_1620 + 1;
      } while (local_1620 != uVar56 - 8);
    }
LAB_005e4a62:
    bVar68 = puVar63 != &local_1200;
    if (!bVar68) {
      return bVar68;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }